

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

int ossl_provider_disable_fallback_loading(OSSL_LIB_CTX *libctx)

{
  int iVar1;
  provider_store_st *lock;
  OSSL_LIB_CTX *in_RDI;
  provider_store_st *store;
  int local_4;
  
  lock = get_provider_store(in_RDI);
  if (lock == (provider_store_st *)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = CRYPTO_THREAD_write_lock(lock);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      lock->field_0x48 = lock->field_0x48 & 0xfe;
      CRYPTO_THREAD_unlock(lock);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ossl_provider_disable_fallback_loading(OSSL_LIB_CTX *libctx)
{
    struct provider_store_st *store;

    if ((store = get_provider_store(libctx)) != NULL) {
        if (!CRYPTO_THREAD_write_lock(store->lock))
            return 0;
        store->use_fallbacks = 0;
        CRYPTO_THREAD_unlock(store->lock);
        return 1;
    }
    return 0;
}